

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O2

void __thiscall KDIS::KException::~KException(KException *this)

{
  *(undefined ***)this = &PTR__KException_00214b58;
  std::__cxx11::string::~string((string *)&this->m_sErrorText);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~KException() throw()
    {
    }